

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avltree.cc
# Opt level: O1

avl_node * avl_prev(avl_node *node)

{
  avl_node *paVar1;
  avl_node *paVar2;
  
  if (node != (avl_node *)0x0) {
    paVar2 = node->left;
    if (node->left != (avl_node *)0x0) {
      do {
        paVar1 = paVar2;
        paVar2 = paVar1->right;
      } while (paVar2 != (avl_node *)0x0);
      return paVar1;
    }
    paVar2 = node->parent;
    while (paVar1 = (avl_node *)((ulong)paVar2 & 0xfffffffffffffffc), paVar1 != (avl_node *)0x0) {
      if (paVar1->right == node) {
        return paVar1;
      }
      node = paVar1;
      paVar2 = paVar1->parent;
    }
  }
  return (avl_node *)0x0;
}

Assistant:

struct avl_node* avl_prev(struct avl_node *node)
{
    if (node == NULL) return NULL;

#ifdef _AVL_NEXT_POINTER
    return node->prev;
#else

    struct avl_node *p;

    // largest value of left subtree
    if (node->left) {
        p = node;
        node = node->left;
        while (node) {
            p = node;
            node = node->right;
        }
        return p;
    }

    // node does not have left child
    if (avl_parent(node)) {
        // find first parent that has left child
        p = node;
        node = avl_parent(node);
        while(node) {
            if (node->right == p) {
                return node;
            }
            p = node;
            node = avl_parent(node);
        }
    }
#endif
    return NULL;
}